

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_relative
                 (char *base,size_t base_size,char *path,size_t path_size,char *relative,
                 size_t relative_size)

{
  bool bVar1;
  ulong local_58;
  size_t size;
  size_t length;
  size_t i;
  size_t relative_size_local;
  char *relative_local;
  size_t path_size_local;
  char *path_local;
  size_t base_size_local;
  char *base_local;
  size_t local_8;
  
  if (((base == (char *)0x0) || (path == (char *)0x0)) || (relative == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    length = 0;
    local_58 = path_size;
    if (base_size < path_size) {
      local_58 = base_size;
    }
    i = 0;
    while( true ) {
      bVar1 = false;
      if ((base[i] == path[i]) && ((base[i] != '\0' || (bVar1 = false, path[i] != '\0')))) {
        bVar1 = i < local_58;
      }
      if (!bVar1) break;
      i = i + 1;
    }
    if (path[i] == '/') {
      i = i + 1;
    }
    for (; path[i] != '\0' && i < relative_size; i = i + 1) {
      relative[length] = path[i];
      length = length + 1;
    }
    relative[length] = '\0';
    local_8 = length + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_relative(const char *base, size_t base_size, const char *path, size_t path_size, char *relative, size_t relative_size)
{
	if (base == NULL || path == NULL || relative == NULL)
	{
		return 0;
	}

	size_t i, length = 0, size = base_size < path_size ? base_size : path_size;

	for (i = 0; base[i] == path[i] && (base[i] != '\0' || path[i] != '\0') && i < size; ++i)
		;

	if (PORTABILITY_PATH_SEPARATOR(path[i]))
	{
		++i;
	}

	for (; path[i] != '\0' && i < relative_size; ++i)
	{
		relative[length++] = path[i];
	}

	relative[length] = '\0';

	return length + 1;
}